

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOICompactRewardDecPOMDPDiscrete::~TOICompactRewardDecPOMDPDiscrete
          (TOICompactRewardDecPOMDPDiscrete *this,void **vtt)

{
  size_type sVar1;
  reference ppRVar2;
  TOIDecPOMDPDiscrete *in_RSI;
  void **in_RDI;
  uint i;
  uint local_14;
  
  *in_RDI = *(void **)&(in_RSI->super_TransitionObservationIndependentMADPDiscrete).
                       super_MultiAgentDecisionProcess;
  *(undefined8 *)((long)in_RDI + *(long *)((long)*in_RDI + -0x50)) =
       *(undefined8 *)
        &(in_RSI->super_TransitionObservationIndependentMADPDiscrete).
         super_MultiAgentDecisionProcess._m_problemFile;
  *(size_type *)((long)in_RDI + *(long *)((long)*in_RDI + -0x58)) =
       (in_RSI->super_TransitionObservationIndependentMADPDiscrete).super_MultiAgentDecisionProcess.
       _m_problemFile._M_string_length;
  *(size_type *)((long)in_RDI + *(long *)((long)*in_RDI + -0x60)) =
       (in_RSI->super_TransitionObservationIndependentMADPDiscrete).super_MultiAgentDecisionProcess.
       _m_problemFile.field_2._M_allocated_capacity;
  *(undefined8 *)((long)in_RDI + *(long *)((long)*in_RDI + -0x40)) =
       *(undefined8 *)
        ((long)&(in_RSI->super_TransitionObservationIndependentMADPDiscrete).
                super_MultiAgentDecisionProcess._m_problemFile.field_2 + 8);
  *(undefined8 *)((long)in_RDI + *(long *)((long)*in_RDI + -0x48)) =
       *(undefined8 *)
        &(in_RSI->super_TransitionObservationIndependentMADPDiscrete).
         super_MultiAgentDecisionProcess._m_unixName;
  in_RDI[0x50] = (void *)(in_RSI->super_TransitionObservationIndependentMADPDiscrete).
                         super_MultiAgentDecisionProcess._m_unixName._M_string_length;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::size
                      ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RDI + 0x5e));
    if (local_14 == sVar1) break;
    ppRVar2 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::operator[]
                        ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RDI + 0x5e),
                         (ulong)local_14);
    if (*ppRVar2 != (value_type)0x0) {
      (*((*ppRVar2)->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface
        [3])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::~vector
            ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI);
  TOIDecPOMDPDiscrete::~TOIDecPOMDPDiscrete(in_RSI,in_RDI);
  return;
}

Assistant:

TOICompactRewardDecPOMDPDiscrete::~TOICompactRewardDecPOMDPDiscrete()
{
    for(unsigned int i=0;i!=_m_p_rModels.size();++i)
        delete(_m_p_rModels[i]);
}